

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall
mkvmuxer::Segment::AddFrameWithAdditional
          (Segment *this,uint8_t *data,uint64_t length,uint8_t *additional,
          uint64_t additional_length,uint64_t add_id,uint64_t track_number,uint64_t timestamp,
          bool is_key)

{
  bool bVar1;
  Frame local_98;
  
  if (additional != (uint8_t *)0x0 && data != (uint8_t *)0x0) {
    Frame::Frame(&local_98);
    bVar1 = Frame::Init(&local_98,data,length);
    if ((bVar1) &&
       (bVar1 = Frame::AddAdditionalData(&local_98,additional,additional_length,add_id), bVar1)) {
      local_98.track_number_ = track_number;
      local_98.timestamp_ = timestamp;
      local_98.is_key_ = is_key;
      bVar1 = AddGenericFrame(this,&local_98);
    }
    else {
      bVar1 = false;
    }
    Frame::~Frame(&local_98);
    return bVar1;
  }
  return false;
}

Assistant:

bool Segment::AddFrameWithAdditional(const uint8_t* data, uint64_t length,
                                     const uint8_t* additional,
                                     uint64_t additional_length,
                                     uint64_t add_id, uint64_t track_number,
                                     uint64_t timestamp, bool is_key) {
  if (!data || !additional)
    return false;

  Frame frame;
  if (!frame.Init(data, length) ||
      !frame.AddAdditionalData(additional, additional_length, add_id)) {
    return false;
  }
  frame.set_track_number(track_number);
  frame.set_timestamp(timestamp);
  frame.set_is_key(is_key);
  return AddGenericFrame(&frame);
}